

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus
ZydisReadDisplacement(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 size)

{
  ZyanStatus ZVar1;
  ZyanU8 value;
  ZyanU16 value_3;
  ZyanU32 value_1;
  ZyanU64 value_2;
  
  if ((instruction->raw).disp.size != '\0') {
    __assert_fail("instruction->raw.disp.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2db,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  (instruction->raw).disp.size = size;
  (instruction->raw).disp.offset = instruction->length;
  switch((uint)size << 0x1d | size - 8 >> 3) {
  case 0:
    ZVar1 = ZydisInputNext(state,instruction,&value);
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    value_2 = (ZyanU64)(char)value;
    break;
  case 1:
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_3,'\x02');
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    value_2 = (ZyanU64)(short)value_3;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2ff,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  case 3:
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_1,'\x04');
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    value_2 = (ZyanU64)(int)value_1;
    break;
  case 7:
    ZVar1 = ZydisInputNextBytes(state,instruction,(ZyanU8 *)&value_2,'\b');
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
  }
  (instruction->raw).disp.value = value_2;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadDisplacement(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 size)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->raw.disp.size == 0);

    instruction->raw.disp.size = size;
    instruction->raw.disp.offset = instruction->length;

    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        instruction->raw.disp.value = *(ZyanI8*)&value;
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        instruction->raw.disp.value = *(ZyanI16*)&value;
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        instruction->raw.disp.value = *(ZyanI32*)&value;
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        instruction->raw.disp.value = *(ZyanI64*)&value;
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}